

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_lines.c
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  int iVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  ALLEGRO_EVENT_QUEUE *pAVar7;
  undefined8 uVar8;
  char *format;
  double __x;
  undefined8 uVar9;
  ALLEGRO_EVENT event;
  ALLEGRO_KEYBOARD_STATE kst;
  int local_a0 [8];
  int local_80;
  int local_7c;
  int local_60;
  undefined1 local_58 [40];
  
  cVar4 = al_install_system(0x5020700,atexit);
  if (cVar4 == '\0') {
    format = "Could not init Allegro.\n";
  }
  else {
    al_init_primitives_addon();
    al_install_keyboard();
    al_install_mouse();
    display = (ALLEGRO_DISPLAY *)al_create_display(0x280,0x1e0);
    if (display == (ALLEGRO_DISPLAY *)0x0) {
      format = "Error creating display\n";
    }
    else {
      uVar9 = 0;
      uVar8 = al_map_rgb_f(0,0,0);
      black.b = (float)(int)uVar9;
      black.r = (float)(int)uVar8;
      black.g = (float)(int)((ulong)uVar8 >> 0x20);
      black.a = (float)((ulong)uVar9 >> 0x20);
      uVar9 = 0x3f800000;
      uVar8 = al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
      white.b = (float)(int)uVar9;
      white.r = (float)(int)uVar8;
      white.g = (float)(int)((ulong)uVar8 >> 0x20);
      white.a = (float)((ulong)uVar9 >> 0x20);
      uVar9 = 0x3f000000;
      uVar8 = al_map_rgb_f(0x3f000000,0x3f000000,0x3f19999a);
      background.b = (float)(int)uVar9;
      background.r = (float)(int)uVar8;
      background.g = (float)(int)((ulong)uVar8 >> 0x20);
      background.a = (float)((ulong)uVar9 >> 0x20);
      if ((1 < argc) && (iVar6 = strcmp(argv[1],"--memory-bitmap"), iVar6 == 0)) {
        al_set_new_bitmap_flags(1);
      }
      dbuf = (ALLEGRO_BITMAP *)al_create_bitmap(0x280,0x1e0);
      if (dbuf != (ALLEGRO_BITMAP *)0x0) {
        al_set_target_bitmap(dbuf);
        al_clear_to_color(background.r,background._8_8_);
        al_draw_rectangle(0x42c90000,0x42c90000,0x4406e000,0x43bdc000,black._0_8_,black._8_8_,0);
        flip();
        pAVar7 = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
        queue = pAVar7;
        uVar8 = al_get_keyboard_event_source();
        al_register_event_source(pAVar7,uVar8);
        pAVar7 = queue;
        uVar8 = al_get_mouse_event_source();
        al_register_event_source(pAVar7,uVar8);
        do {
          while( true ) {
            while (al_wait_for_event(queue,local_a0), local_a0[0] == 0x2e) {
              last_y = -1;
              last_x = -1;
            }
            if (local_a0[0] == 0x15) break;
            if ((local_a0[0] == 10) && (local_80 == 0x3b)) {
              al_destroy_event_queue(queue);
              al_destroy_bitmap(dbuf);
              return 0;
            }
          }
          al_get_keyboard_state(local_58);
          cVar4 = al_key_down(local_58,0xd7);
          cVar5 = '\x01';
          if (cVar4 == '\0') {
            cVar5 = al_key_down(local_58,0xd8);
          }
          iVar3 = local_7c;
          iVar6 = local_80;
          if (local_60 == 1) {
            al_set_target_bitmap();
            fade();
            al_set_blender(0,2,0);
            al_draw_rectangle(0x42c90000,0x42c90000,0x4406e000,0x43bdc000,black._0_8_,black._8_8_,0)
            ;
            uVar8 = 0;
            uVar9 = al_map_rgb_f(0x3f800000,0,0);
            al_draw_filled_rectangle
                      ((float)(iVar6 + -2),(float)(iVar3 + -2),(float)(iVar6 + 2),(float)(iVar3 + 2)
                       ,uVar9,uVar8);
            if ((last_x != -1) || (last_y != -1)) {
              al_set_clipping_rectangle(100,100,0x1b8,0x118);
              if (cVar5 != '\0') {
                al_set_blender(0,2,3);
              }
              al_draw_line((float)last_x,(float)last_y,(float)iVar6,(float)iVar3,white._0_8_,
                           white._8_8_);
              last_y = -1;
              last_x = -1;
              goto LAB_001029f1;
            }
            last_x = iVar6;
            last_y = iVar3;
          }
          else {
            al_set_target_bitmap(dbuf);
            fade();
            al_set_blender(0,2,0);
            al_draw_rectangle(0x42c90000,0x42c90000,0x4406e000,0x43bdc000,black._0_8_,black._8_8_,0)
            ;
            uVar8 = 0;
            uVar9 = al_map_rgb_f(0x3f800000,0,0);
            al_draw_filled_rectangle
                      ((float)(iVar6 + -2),(float)(iVar3 + -2),(float)(iVar6 + 2),(float)(iVar3 + 2)
                       ,uVar9,uVar8);
            al_set_clipping_rectangle(100,100,0x1b8,0x118);
            if (cVar5 != '\0') {
              al_set_blender(0,2,3);
            }
            __x = 0.0;
            do {
              dVar1 = cos(__x);
              dVar2 = sin(__x);
              al_draw_line((float)iVar6,(float)iVar3,(float)(dVar1 * 40.0 + (double)iVar6),
                           (float)(dVar2 * 40.0 + (double)iVar3),white._0_8_,white._8_8_);
              __x = __x + 0.19634954084936207;
            } while (__x < 6.283185307179586);
LAB_001029f1:
            al_set_clipping_rectangle(0,0,0x280,0x1e0);
          }
          flip();
        } while( true );
      }
      format = "Error creating double buffer\n";
      dbuf = (ALLEGRO_BITMAP *)0x0;
    }
  }
  abort_example(format);
  al_set_target_backbuffer(display);
  al_set_blender(0,1,0);
  al_draw_bitmap(0,0,dbuf,0);
  iVar6 = al_flip_display();
  return iVar6;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_EVENT event;
   ALLEGRO_KEYBOARD_STATE kst;
   bool blend;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_init_primitives_addon();
   al_install_keyboard();
   al_install_mouse();

   display = al_create_display(W, H);
   if (!display) {
      abort_example("Error creating display\n");
   }

   black = al_map_rgb_f(0.0, 0.0, 0.0);
   white = al_map_rgb_f(1.0, 1.0, 1.0);
   background = al_map_rgb_f(0.5, 0.5, 0.6);

   if (argc > 1 && 0 == strcmp(argv[1], "--memory-bitmap")) {
      al_set_new_bitmap_flags(ALLEGRO_MEMORY_BITMAP);
   }
   dbuf = al_create_bitmap(W, H);
   if (!dbuf) {
      abort_example("Error creating double buffer\n");
   }

   al_set_target_bitmap(dbuf);
   al_clear_to_color(background);
   draw_clip_rect();
   flip();

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_mouse_event_source());

   while (true) {
      al_wait_for_event(queue, &event);
      if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_DOWN) {
         al_get_keyboard_state(&kst);
         blend = al_key_down(&kst, ALLEGRO_KEY_LSHIFT) ||
            al_key_down(&kst, ALLEGRO_KEY_RSHIFT);
         if (event.mouse.button == 1) {
            plonk(event.mouse.x, event.mouse.y, blend);
         } else {
            splat(event.mouse.x, event.mouse.y, blend);
         }
      }
      else if (event.type == ALLEGRO_EVENT_DISPLAY_SWITCH_OUT) {
         last_x = last_y = -1;
      }
      else if (event.type == ALLEGRO_EVENT_KEY_DOWN &&
         event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
      {
         break;
      }
   }

   al_destroy_event_queue(queue);
   al_destroy_bitmap(dbuf);

   return 0;
}